

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

char * __thiscall
MemoryLeakDetector::reallocateMemoryAndLeakInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  ulong uVar3;
  MemoryLeakDetectorNode *node;
  
  uVar3 = size + 3 & 0xfffffffffffffff8;
  pcVar2 = (char *)(*PlatformSpecificRealloc)
                             (memory,uVar3 + (ulong)!allocatNodesSeperately * 0x40 + 8);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (allocatNodesSeperately) {
      iVar1 = (*allocator->_vptr_TestMemoryAllocator[8])(allocator,0x40);
      node = (MemoryLeakDetectorNode *)CONCAT44(extraout_var,iVar1);
    }
    else {
      node = (MemoryLeakDetectorNode *)(pcVar2 + uVar3 + 8);
    }
    storeLeakInformation(this,node,pcVar2,size,allocator,file,line);
    pcVar2 = *(char **)(node + 0x10);
  }
  return pcVar2;
}

Assistant:

char* MemoryLeakDetector::reallocateMemoryAndLeakInformation(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
    char* new_memory = reallocateMemoryWithAccountingInformation(allocator, memory, size, file, line, allocatNodesSeperately);
    if (new_memory == NULLPTR) return NULLPTR;

    MemoryLeakDetectorNode *node = createMemoryLeakAccountingInformation(allocator, size, new_memory, allocatNodesSeperately);
    storeLeakInformation(node, new_memory, size, allocator, file, line);
    return node->memory_;
}